

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O0

uint8_t GmmIsReconstructableSurface(GMM_RESOURCE_FORMAT Format)

{
  uint8_t local_d;
  uint8_t Status;
  GMM_RESOURCE_FORMAT Format_local;
  
  if ((((Format == GMM_FORMAT_YCRCB_NORMAL) || (Format == GMM_FORMAT_AYUV)) ||
      (Format == GMM_FORMAT_NV12)) ||
     (((Format - GMM_FORMAT_P8 < 4 || (Format - GMM_FORMAT_Y210 < 3)) ||
      ((Format - GMM_FORMAT_Y216 < 2 || (Format == GMM_FORMAT_YUY2_2x1)))))) {
    local_d = '\x01';
  }
  else {
    local_d = '\0';
  }
  return local_d;
}

Assistant:

uint8_t GMM_STDCALL GmmIsReconstructableSurface(GMM_RESOURCE_FORMAT Format)
{
    uint8_t Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_AYUV:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_Y210:
        case GMM_FORMAT_Y216:
        case GMM_FORMAT_Y212:
        case GMM_FORMAT_Y410:
        case GMM_FORMAT_Y416:
        case GMM_FORMAT_P8:
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_YUY2_2x1:
        case GMM_FORMAT_YUY2:
            Status = 1;
            break;
        default:
            Status = 0;
            break;
    }
    return Status;
}